

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer-helpers.h
# Opt level: O0

void capnp::_::PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::set
               (PointerBuilder builder,ArrayPtr<const_capnp::Text::Reader> value)

{
  StructDataBitCount *this;
  size_t sVar1;
  Reader *pRVar2;
  Reader *element;
  Reader *__end0;
  Reader *__begin0;
  ArrayPtr<const_capnp::Text::Reader> *__range3;
  uint i;
  undefined1 local_40 [8];
  Builder l;
  ArrayPtr<const_capnp::Text::Reader> value_local;
  
  l.builder._32_8_ = value.ptr;
  sVar1 = kj::ArrayPtr<const_capnp::Text::Reader>::size
                    ((ArrayPtr<const_capnp::Text::Reader> *)&l.builder.structDataSize);
  init((PointerHelpers<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6> *)local_40,
       (EVP_PKEY_CTX *)(sVar1 & 0xffffffff));
  __range3._4_4_ = 0;
  this = &l.builder.structDataSize;
  __end0 = kj::ArrayPtr<const_capnp::Text::Reader>::begin
                     ((ArrayPtr<const_capnp::Text::Reader> *)this);
  pRVar2 = kj::ArrayPtr<const_capnp::Text::Reader>::end((ArrayPtr<const_capnp::Text::Reader> *)this)
  ;
  for (; __end0 != pRVar2; __end0 = __end0 + 1) {
    List<capnp::Text,_(capnp::Kind)1>::Builder::set
              ((Builder *)local_40,__range3._4_4_,(Reader)(__end0->super_StringPtr).content);
    __range3._4_4_ = __range3._4_4_ + 1;
  }
  return;
}

Assistant:

static void set(PointerBuilder builder, kj::ArrayPtr<const ReaderFor<T>> value) {
    auto l = init(builder, value.size());
    uint i = 0;
    for (auto& element: value) {
      l.set(i++, element);
    }
  }